

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

int read_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,int skip)

{
  CommonModeInfoParams *mi_params;
  _Bool _Var1;
  int iVar2;
  uint8_t *segment_ids;
  BLOCK_SIZE bsize;
  byte bVar3;
  int iVar4;
  uint ref;
  ulong uVar5;
  uint uVar6;
  BLOCK_SIZE bsize_00;
  uint uVar7;
  uint uVar8;
  
  iVar2 = xd->mi_col;
  mi_params = &cm->mi_params;
  segment_ids = cm->cur_frame->seg_map;
  _Var1 = xd->left_available;
  iVar4 = (int)mi_params;
  bsize = (BLOCK_SIZE)xd->mi_row;
  if (xd->up_available == false) {
    uVar7 = 0xff;
    ref = 0xff;
    uVar8 = 0xff;
    uVar6 = 0xff;
    if ((_Var1 & 1U) != 0) goto LAB_00170f81;
  }
  else {
    bsize_00 = bsize - BLOCK_4X8;
    uVar8 = 0xff;
    uVar7 = 0xff;
    if ((_Var1 & 1U) != 0) {
      bVar3 = get_segment_id(mi_params,segment_ids,bsize_00,iVar2 + -1,iVar4);
      uVar7 = (uint)bVar3;
    }
    bVar3 = get_segment_id(mi_params,segment_ids,bsize_00,iVar2,iVar4);
    ref = (uint)bVar3;
    uVar6 = ref;
    if ((_Var1 & 1U) != 0) {
LAB_00170f81:
      ref = uVar6;
      bVar3 = get_segment_id(mi_params,segment_ids,bsize,iVar2 + -1,iVar4);
      uVar8 = (uint)bVar3;
    }
    if (uVar7 != 0xff) {
      if ((uVar7 == ref) && (uVar7 == uVar8)) {
        uVar5 = 2;
        uVar6 = uVar7;
      }
      else {
        uVar5 = (ulong)((uVar8 == ref || uVar7 == uVar8) || uVar7 == ref);
        uVar6 = ref;
      }
      goto LAB_00170fde;
    }
  }
  uVar7 = 0xff;
  uVar5 = 0;
  uVar6 = ref;
LAB_00170fde:
  if ((char)ref == -1) {
    ref = 0;
    if (uVar8 != 0xff) {
      ref = uVar8;
    }
  }
  else if ((uVar8 != 0xff) && (ref = uVar8, uVar7 == uVar6)) {
    ref = uVar6;
  }
  if (skip == 0) {
    iVar4 = aom_read_symbol_(r,(xd->tile_ctx->seg).spatial_pred_seg_cdf[uVar5],8);
    iVar2 = (cm->seg).last_active_segid;
    ref = av1_neg_deinterleave(iVar4,ref,iVar2 + 1);
    if ((int)ref < 0 || iVar2 < (int)ref) {
      aom_internal_error(xd->error_info,AOM_CODEC_CORRUPT_FRAME,"Corrupted segment_ids");
    }
  }
  return ref;
}

Assistant:

static int read_segment_id(AV1_COMMON *const cm, const MACROBLOCKD *const xd,
                           aom_reader *r, int skip) {
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(cm, xd, &cdf_num, 0);
  if (skip) return pred;

  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  struct segmentation *const seg = &cm->seg;
  struct segmentation_probs *const segp = &ec_ctx->seg;
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  const int coded_id = aom_read_symbol(r, pred_cdf, MAX_SEGMENTS, ACCT_STR);
  const int segment_id =
      av1_neg_deinterleave(coded_id, pred, seg->last_active_segid + 1);

  if (segment_id < 0 || segment_id > seg->last_active_segid) {
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Corrupted segment_ids");
  }
  return segment_id;
}